

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

string * __thiscall
tonk::HexString_abi_cxx11_(string *__return_storage_ptr__,tonk *this,uint64_t value)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  allocator local_29;
  char hex [17];
  
  hex[0x10] = '\0';
  lVar2 = 0xe;
  do {
    if ((int)lVar2 == -2) {
      pcVar3 = hex;
LAB_0012990a:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_29);
      return __return_storage_ptr__;
    }
    cVar1 = "0123456789abcdef"[(uint)this >> 4 & 0xf];
    hex[lVar2 + 1] = "0123456789abcdef"[(uint)this & 0xf];
    hex[lVar2] = cVar1;
    if (this < (tonk *)0x100) {
      pcVar3 = hex + lVar2;
      goto LAB_0012990a;
    }
    this = (tonk *)((ulong)this >> 8);
    lVar2 = lVar2 + -2;
  } while( true );
}

Assistant:

std::string HexString(uint64_t value)
{
    static const char* H = "0123456789abcdef";

    char hex[16 + 1];
    hex[16] = '\0';

    char* hexWrite = &hex[14];
    for (unsigned i = 0; i < 8; ++i)
    {
        hexWrite[1] = H[value & 15];
        hexWrite[0] = H[(value >> 4) & 15];

        value >>= 8;
        if (value == 0)
            return hexWrite;
        hexWrite -= 2;
    }

    return hex;
}